

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precision.cpp
# Opt level: O1

float verify_accuracy<float,sumlib::neumaier,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                (long *param_1)

{
  float fVar1;
  ulong uVar2;
  pointer pfVar3;
  ulong *puVar4;
  ulong uVar5;
  result_type rVar6;
  float fVar7;
  normal_distribution<float> nd;
  float local_90;
  float local_8c;
  vector<float,_std::allocator<float>_> local_88;
  ulong local_70;
  undefined1 local_68 [16];
  normal_distribution<float> local_58;
  undefined1 local_48 [16];
  ulong *local_38;
  
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  puVar4 = (ulong *)*param_1;
  local_38 = (ulong *)param_1[1];
  if (puVar4 == local_38) {
    local_90 = 0.0;
  }
  else {
    local_90 = 0.0;
    do {
      local_70 = *puVar4;
      uVar2 = puVar4[1];
      local_58._M_param._M_stddev = *(float *)(puVar4 + 2);
      local_58._M_param._M_mean = 0.0;
      local_58._M_saved = 0.0;
      local_58._M_saved_available = false;
      if (1 < local_70) {
        uVar5 = local_70 >> 1;
        local_68._0_4_ = (float)(long)uVar2;
        do {
          rVar6 = std::normal_distribution<float>::operator()
                            (&local_58,
                             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                              *)&stack0x00000008,&local_58._M_param);
          local_48._0_4_ = rVar6;
          local_8c = rVar6 + (float)local_68._0_4_;
          if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_88,
                       (iterator)
                       local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_8c);
          }
          else {
            *local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = local_8c;
            local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_8c = (float)local_68._0_4_ - (float)local_48._0_4_;
          if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_88,
                       (iterator)
                       local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_8c);
          }
          else {
            *local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = local_8c;
            local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      local_90 = local_90 + (float)(uVar2 * local_70);
      puVar4 = puVar4 + 3;
    } while (puVar4 != local_38);
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
            ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)&stack0x00000008);
  if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_68._0_4_ = 0.0;
    local_48._0_4_ = 0.0;
  }
  else {
    local_48._0_4_ = 0.0;
    pfVar3 = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar7 = 0.0;
    do {
      fVar1 = *pfVar3;
      local_68._0_4_ = fVar7 + fVar1;
      local_48._0_4_ =
           (float)local_48._0_4_ +
           (float)(~-(uint)(ABS(fVar1) < ABS(fVar7)) &
                   (uint)((fVar1 - (float)local_68._0_4_) + fVar7) |
                  (uint)((fVar7 - (float)local_68._0_4_) + fVar1) & -(uint)(ABS(fVar1) < ABS(fVar7))
                  );
      pfVar3 = pfVar3 + 1;
      fVar7 = (float)local_68._0_4_;
    } while (pfVar3 != local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    local_68 = ZEXT416((uint)local_68._0_4_);
    local_48 = ZEXT416((uint)local_48._0_4_);
    operator_delete(local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return ((float)local_68._0_4_ + (float)local_48._0_4_) - local_90;
}

Assistant:

T verify_accuracy( vector<distribution<T>> dists, RNG rng ) {
    vector<T> numbers;
    T total = 0;
    for( distribution<T> d : dists ) {
        normal_distribution<T> nd( 0, d.deviation );

        for( uint64_t i = 0; i < (d.terms/2); i++ ) {
            T deviation = nd( rng );
            numbers.push_back( d.mean + deviation );
            numbers.push_back( d.mean - deviation );
        }

        total += d.terms * d.mean;
    }

    shuffle( numbers.begin(), numbers.end(), rng );

    SUMMER<T> sum;
    for( auto x : numbers )
        sum += x;

    return sum.get()-total;
}